

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForMessage
          (Generator *this,Descriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  string descriptor_name;
  string message_options;
  string local_80;
  string local_60;
  string local_40;
  
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      FixOptionsForMessage(this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < *(int *)(descriptor + 0x48));
  }
  if (0 < *(int *)(descriptor + 0x38)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      FixOptionsForOneof(this,(OneofDescriptor *)(*(long *)(descriptor + 0x40) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x30;
    } while (lVar3 < *(int *)(descriptor + 0x38));
  }
  if (0 < *(int *)(descriptor + 0x58)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      FixOptionsForEnum(this,(EnumDescriptor *)(*(long *)(descriptor + 0x60) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < *(int *)(descriptor + 0x58));
  }
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < *(int *)(descriptor + 0x2c));
  }
  if (0 < *(int *)(descriptor + 0x78)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x80) + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar3 < *(int *)(descriptor + 0x78));
  }
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"MessageOptions","");
  MessageLite::SerializeAsString_abi_cxx11_(&local_40,*(MessageLite **)(descriptor + 0x20));
  OptionsValue(&local_60,this,&local_80,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar2 != 0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_80,this,descriptor);
    io::Printer::Print(this->printer_,
                       "$descriptor$.has_options = True\n$descriptor$._options = $options$\n",
                       "descriptor",&local_80,"options",&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::FixOptionsForMessage(const Descriptor& descriptor) const {
  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixOptionsForMessage(*descriptor.nested_type(i));
  }
  // Oneofs.
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    FixOptionsForOneof(*descriptor.oneof_decl(i));
  }
  // Enums.
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    FixOptionsForEnum(*descriptor.enum_type(i));
  }
  // Fields.
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    FixOptionsForField(field);
  }
  // Extensions.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    const FieldDescriptor& field = *descriptor.extension(i);
    FixOptionsForField(field);
  }
  // Message option for this message.
  string message_options = OptionsValue(
      "MessageOptions", descriptor.options().SerializeAsString());
  if (message_options != "None") {
    string descriptor_name = ModuleLevelDescriptorName(descriptor);
    PrintDescriptorOptionsFixingCode(descriptor_name,
                                     message_options,
                                     printer_);
  }
}